

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  BaseType BVar4;
  Dim DVar5;
  StorageClass SVar6;
  bool bVar7;
  bool bVar8;
  ExecutionModel EVar9;
  SPIRVariable *pSVar10;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  long *plVar14;
  char *pcVar15;
  size_type sVar16;
  Bitset *pBVar17;
  SPIRType *pSVar18;
  BuiltIn builtin;
  uint uVar19;
  int iVar20;
  _Base_ptr p_Var21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  size_type *psVar22;
  char (*pacVar23) [2];
  ulong *puVar24;
  uint32_t id;
  _Base_ptr p_Var25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  string *psVar29;
  string type_name;
  uint32_t array_size;
  char *cv_qualifier;
  string address_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string *psVar30;
  string local_138;
  byte local_111;
  string local_110;
  char local_e9;
  char *local_e8;
  int local_e0 [2];
  ulong local_d8;
  uint local_cc;
  string local_c8;
  SPIRType *local_a8;
  SPIRType *local_a0;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  pSVar10 = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
  local_d8 = (ulong)pSVar11->storage;
  pSVar12 = Compiler::get_variable_data_type((Compiler *)this,pSVar10);
  local_e9 = Compiler::is_physical_pointer((Compiler *)this,pSVar11);
  pSVar18 = pSVar11;
  if (!(bool)local_e9) {
    pSVar18 = pSVar12;
  }
  uVar3 = (pSVar10->super_IVariant).self.id;
  id = (pSVar10->basevariable).id;
  if (id == 0) {
    id = uVar3;
  }
  if (arg->alias_global_variable == false) {
    id = uVar3;
  }
  local_a8 = pSVar12;
  local_a0 = pSVar11;
  if ((arg->alias_global_variable != false || (bool)local_e9) ||
     (bVar7 = Compiler::is_pointer((Compiler *)this,pSVar11), !bVar7)) {
    bVar7 = false;
  }
  else {
    bVar7 = arg->write_count == 0;
  }
  BVar4 = pSVar18->basetype;
  DVar5 = (pSVar18->image).dim;
  if ((DVar5 == DimSubpassData && BVar4 == Image) &&
     ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
    bVar7 = false;
  }
  else {
    bVar7 = (bool)((int)local_d8 == 0 | bVar7);
  }
  local_cc = BVar4 - AccelerationStructure;
  local_e8 = "const ";
  if (!bVar7) {
    local_e8 = "";
  }
  if (0xfffffffc < local_cc) {
    local_e8 = "";
  }
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((DVar5 == Dim2D & BVar4 == SampledImage & ~arg->alias_global_variable) == 1) &&
     (pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar18->image).type.id),
     pSVar11->basetype - Half < 3)) {
    p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
    p_Var25 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    p_Var21 = &p_Var1->_M_header;
    for (; p_Var25 != (_Base_ptr)0x0; p_Var25 = (&p_Var25->_M_left)[bVar7]) {
      bVar7 = (byte)(char)p_Var25[1]._M_color < 0x44;
      if (!bVar7) {
        p_Var21 = p_Var25;
      }
    }
    p_Var25 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
       (p_Var25 = p_Var21, 0x44 < (byte)(char)p_Var21[1]._M_color)) {
      p_Var25 = &p_Var1->_M_header;
    }
    bVar7 = (_Rb_tree_header *)p_Var25 != p_Var1;
  }
  else {
    bVar7 = false;
  }
  get_argument_address_space_abi_cxx11_(&local_c8,this,pSVar10);
  local_111 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationBuiltIn);
  local_e0[0] = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
  local_e0[1] = extraout_var;
  uVar3 = (pSVar10->basevariable).id;
  if ((uVar3 == 0) ||
     ((uVar3 != (this->stage_in_ptr_var_id).id && (uVar3 != (this->stage_out_ptr_var_id).id)))) {
    if ((local_111 != 0) &&
       (EVar9 = Compiler::get_execution_model((Compiler *)this), EVar9 != ExecutionModelMeshEXT)) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar10->super_IVariant).field_0xc);
      SVar6 = pSVar11->storage;
      builtin = local_e0[0];
      if ((builtin - BuiltInTessLevelOuter < 2) && (SVar6 == StorageClassInput)) {
        bVar7 = false;
LAB_00222543:
        this->is_using_builtin_array = bVar7;
      }
      else {
        bVar7 = true;
        if (builtin - BuiltInVertexId < 0xfffffffe) goto LAB_00222543;
      }
      if (((SVar6 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) == 0)) &&
         (bVar7 = CompilerGLSL::is_stage_output_builtin_masked(&this->super_CompilerGLSL,builtin),
         !bVar7)) {
        this->is_using_builtin_array = true;
      }
      if (this->is_using_builtin_array == true) {
        uVar19 = (arg->id).id;
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar19;
        builtin_type_decl_abi_cxx11_(&local_110,this,local_e0[0],uVar19);
        join<char_const*&,std::__cxx11::string>
                  (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
      }
      else {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar18);
        join<char_const*&,std::__cxx11::string>
                  (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
      }
      goto LAB_00222671;
    }
    bVar8 = is_var_runtime_size_array(this,pSVar10);
    if (bVar8) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar18->parent_type).id);
      pacVar23 = (char (*) [2])(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
      (**(_func_int **)(pacVar23 + 0x4c))(&local_138,this,pSVar11,(ulong)(arg->id).id);
      if (pSVar18->basetype == AccelerationStructure) {
        join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2]>
                  (&local_110,(spirv_cross *)"spvDescriptorArray<",(char (*) [20])&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49aa,
                   pacVar23);
      }
      else if (local_cc < 0xfffffffd) {
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49a9;
        join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3]>
                  (&local_110,(spirv_cross *)"spvDescriptorArray<",(char (*) [20])&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                   (char (*) [2])&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49a9,
                   (char (*) [3])__return_storage_ptr__);
      }
      else {
        join<char_const(&)[20],char_const*&,std::__cxx11::string&,char_const(&)[2]>
                  (&local_110,(spirv_cross *)"spvDescriptorArray<",(char (*) [20])&local_e8,
                   (char **)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49aa,
                   (char (*) [2])in_R9);
      }
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d7104;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x2d7104);
      psVar29 = &local_138;
      goto LAB_00222699;
    }
    if ((((int)local_d8 == 0xc) || ((int)local_d8 == 2)) &&
       (bVar8 = Compiler::is_array((Compiler *)this,pSVar18), bVar8)) {
      this->is_using_builtin_array = true;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_110,this,pSVar18,(ulong)(arg->id).id);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c4813;
      join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c4813,
                 (char (*) [2])in_R8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      goto LAB_0022268a;
    }
    if (bVar7) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar18->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar11,0);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49aa;
      join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                (&local_138,(spirv_cross *)&local_e8,(char **)"spvDynamicImageSampler<",
                 (char (*) [24])&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49aa,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      Compiler::set_extended_decoration
                ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
      goto LAB_002226a7;
    }
    bVar7 = Compiler::is_pointer((Compiler *)this,local_a8);
    if (!bVar7) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar18);
      join<char_const*&,std::__cxx11::string>
                (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
      goto LAB_00222671;
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_138,this,pSVar18);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if (*local_e8 != '\0') {
      join<char_const(&)[2],char_const*&>
                (&local_138,(spirv_cross *)0x2be236,(char (*) [2])&local_e8,(char **)ts_1);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_138._M_dataplus._M_p);
      _Var27._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_002226a7;
      goto LAB_002226a2;
    }
  }
  else {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar18);
    join<char_const*&,std::__cxx11::string>
              (&local_138,(spirv_cross *)&local_e8,(char **)&local_110,ts_1);
LAB_00222671:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
LAB_0022268a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    psVar29 = &local_110;
LAB_00222699:
    _Var27._M_p = (pointer)(&(psVar29->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var27._M_p != &psVar29->field_2) {
LAB_002226a2:
      operator_delete(_Var27._M_p);
    }
  }
LAB_002226a7:
  if (local_e9 != '\0') {
LAB_002226b2:
    if (((this->msl_options).force_native_arrays != true) ||
       (bVar7 = Compiler::is_array((Compiler *)this,pSVar18), !bVar7)) {
      psVar29 = __return_storage_ptr__;
      if ((char *)local_c8._M_string_length != (char *)0x0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_138,(spirv_cross *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                   (char (*) [2])__return_storage_ptr__,in_R8);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
      psVar30 = psVar29;
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
      goto LAB_00222941;
    }
    psVar29 = __return_storage_ptr__;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"thread const ","");
    puVar13 = (undefined8 *)
              ::std::__cxx11::string::_M_append
                        ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    paVar28 = &local_138.field_2;
    psVar22 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar22) {
      local_138.field_2._M_allocated_capacity = *psVar22;
      local_138.field_2._8_8_ = puVar13[3];
      local_138._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar22;
      local_138._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_138._M_string_length = puVar13[1];
    *puVar13 = psVar22;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)psVar29,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar28) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)psVar29);
    pcVar15 = to_restrict(this,id,true);
    if (*pcVar15 != '\0') {
      ::std::__cxx11::string::append((char *)psVar29);
      ::std::__cxx11::string::append((char *)psVar29);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar28) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)psVar29);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&local_138,this,pSVar18,(ulong)id);
    ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
LAB_00222ec8:
    paVar28 = &local_138.field_2;
    _Var27._M_p = local_138._M_dataplus._M_p;
LAB_00222ecd:
    psVar30 = psVar29;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var27._M_p != paVar28) {
      operator_delete(_Var27._M_p);
      psVar30 = psVar29;
    }
    goto LAB_00222edb;
  }
  psVar29 = __return_storage_ptr__;
  if (local_111 == 0) {
    bVar7 = Compiler::is_pointer((Compiler *)this,local_a0);
    uVar19 = (int)local_d8 - 9;
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)CONCAT31((int3)(uVar19 >> 8),uVar19 < 0xfffffffe);
    psVar29 = __return_storage_ptr__;
    if (!bVar7 && uVar19 >= 0xfffffffe) goto LAB_002226b2;
  }
  bVar7 = Compiler::is_array((Compiler *)this,pSVar18);
  pacVar23 = (char (*) [2])CONCAT71((int7)((ulong)ts_1 >> 8),0xfffffffc < local_cc);
  if (!bVar7 || 0xfffffffc < local_cc) {
    psVar30 = psVar29;
    if ((BVar4 & ~SByte) != Image) {
      local_138._M_dataplus._M_p._0_4_ = (pSVar10->basevariable).id;
      sVar16 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(this->pull_model_inputs)._M_h,(key_type *)&local_138);
      if ((sVar16 == 0) || (psVar30 = psVar29, pSVar18->basetype == Struct)) {
        if ((char *)local_c8._M_string_length != (char *)0x0) {
          bVar7 = Compiler::is_pointer((Compiler *)this,local_a8);
          if (bVar7) {
            if (*local_e8 == '\0') {
              ::std::__cxx11::string::push_back((char)psVar29);
            }
            join<std::__cxx11::string&,char_const(&)[2]>
                      (&local_138,(spirv_cross *)&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236
                       ,pacVar23);
            ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
          }
          else {
            psVar30 = psVar29;
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&local_138,(spirv_cross *)&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236
                       ,(char (*) [2])psVar29,in_R8);
            ::std::__cxx11::string::operator=((string *)psVar29,(string *)&local_138);
            psVar29 = psVar30;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
        }
        ::std::__cxx11::string::append((char *)psVar29);
        ::std::__cxx11::string::append((char *)psVar29);
        to_restrict(this,id,true);
        ::std::__cxx11::string::append((char *)psVar29);
        CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
        psVar30 = psVar29;
        ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
        goto LAB_00222941;
      }
    }
    if ((BVar4 & ~SByte) == Image) {
      bVar7 = is_var_runtime_size_array(this,pSVar10);
      if (bVar7) {
        paVar28 = &local_68;
        local_78[0] = paVar28;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,local_c8._M_dataplus._M_p,
                   (char *)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
        ::std::__cxx11::string::append((char *)local_78);
        plVar14 = (long *)::std::__cxx11::string::_M_append
                                    ((char *)local_78,(ulong)(psVar30->_M_dataplus)._M_p);
        psVar22 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_98.field_2._M_allocated_capacity = *psVar22;
          local_98.field_2._8_8_ = plVar14[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar22;
          local_98._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_98._M_string_length = plVar14[1];
        *plVar14 = (long)psVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar13 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
        paVar2 = &local_110.field_2;
        puVar24 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_110.field_2._M_allocated_capacity = *puVar24;
          local_110.field_2._8_8_ = puVar13[3];
          local_110._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar24;
          local_110._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_110._M_string_length = puVar13[1];
        *puVar13 = puVar24;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id,true);
        uVar26 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar2) {
          uVar26 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar26 < local_50._M_string_length + local_110._M_string_length) {
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            uVar26 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_50._M_string_length + local_110._M_string_length)
          goto LAB_00223346;
          puVar13 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&local_50,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
          psVar29 = psVar30;
        }
        else {
LAB_00223346:
          puVar13 = (undefined8 *)
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_110,(ulong)local_50._M_dataplus._M_p);
          psVar29 = psVar30;
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        psVar22 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_138.field_2._M_allocated_capacity = *psVar22;
          local_138.field_2._8_8_ = puVar13[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar22;
          local_138._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_138._M_string_length = puVar13[1];
        *puVar13 = psVar22;
        puVar13[1] = 0;
        *(char *)psVar22 = '\0';
        ::std::__cxx11::string::operator=((string *)psVar29,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        _Var27._M_p = (pointer)local_78[0];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
          _Var27._M_p = (pointer)local_78[0];
        }
        goto LAB_00222ecd;
      }
      if ((pSVar18->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        local_110._M_dataplus._M_p =
             descriptor_address_space(this,id,(StorageClass)local_d8,"thread const");
        psVar29 = psVar30;
        join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                  (&local_138,(spirv_cross *)&local_110,(char **)0x2be236,(char (*) [2])psVar30,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)psVar30,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)psVar29);
        CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
        ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
        goto LAB_00222ec8;
      }
      ::std::__cxx11::string::append((char *)psVar30);
      psVar29 = psVar30;
      CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
      psVar30 = psVar29;
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
    }
    else {
      psVar29 = psVar30;
      if ((char *)local_c8._M_string_length != (char *)0x0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_138,(spirv_cross *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                   (char (*) [2])psVar30,in_R8);
        ::std::__cxx11::string::operator=((string *)psVar30,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)psVar30);
      CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
      psVar30 = psVar29;
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
    }
LAB_00222941:
    _Var27._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00222edb;
  }
  else {
    if ((char *)local_c8._M_string_length != (char *)0x0) {
      psVar30 = psVar29;
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_138,(spirv_cross *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                 (char (*) [2])psVar29,in_R8);
      ::std::__cxx11::string::operator=((string *)psVar29,(string *)&local_138);
      psVar29 = psVar30;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
        psVar29 = psVar30;
      }
    }
    bVar7 = is_var_runtime_size_array(this,pSVar10);
    if ((!bVar7) &&
       (pcVar15 = descriptor_address_space(this,id,(StorageClass)local_d8,(char *)0x0),
       pcVar15 != (char *)0x0)) {
      ::std::__cxx11::string::append((char *)psVar29);
      ::std::__cxx11::string::append((char *)psVar29);
    }
    EVar9 = Compiler::get_execution_model((Compiler *)this);
    if ((local_111 & EVar9 == ExecutionModelTessellationControl & local_e0[0] - 0xbU < 2) == 1) {
      bVar7 = Compiler::is_tessellating_triangles((Compiler *)this);
      bVar8 = local_e0[0] != 0xc;
      iVar20 = (uint)bVar8 * 2 + 2;
      if (bVar7) {
        iVar20 = (uint)bVar8 * 2 + 1;
      }
      local_110._M_dataplus._M_p._0_4_ = iVar20;
      if (bVar8 || !bVar7) {
        ::std::__cxx11::string::append((char *)psVar29);
        CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
        ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)psVar29);
        join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  (&local_138,(spirv_cross *)0x2c1a1a,(char (*) [2])&local_110,(uint *)0x2c191f,
                   (char (*) [2])in_R8);
        ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
        goto LAB_00222ec8;
      }
      ::std::__cxx11::string::append((char *)psVar29);
      CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,id,true);
      psVar30 = psVar29;
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
      goto LAB_00222941;
    }
    bVar7 = is_var_runtime_size_array(this,pSVar10);
    if (!bVar7) {
      psVar30 = psVar29;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_138,this,pSVar18,(ulong)id);
      ::std::__cxx11::string::append((char *)psVar29);
      pcVar15 = to_restrict(this,id,true);
      if (*pcVar15 != '\0') {
        ::std::__cxx11::string::append((char *)psVar29);
        ::std::__cxx11::string::append((char *)psVar29);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_110,&this->super_CompilerGLSL,id,true);
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_110._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_138._M_string_length != 0) {
        ::std::__cxx11::string::append((char *)psVar29);
        ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
      }
      goto LAB_00222941;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_110,&this->super_CompilerGLSL,id,true);
    puVar13 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x2be236);
    psVar22 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar22) {
      local_138.field_2._M_allocated_capacity = *psVar22;
      local_138.field_2._8_8_ = puVar13[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar22;
      local_138._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_138._M_string_length = puVar13[1];
    *puVar13 = psVar22;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    _Var27._M_p = local_110._M_dataplus._M_p;
    psVar30 = psVar29;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_00222edb;
  }
  operator_delete(_Var27._M_p);
LAB_00222edb:
  pSVar10 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
  if (pSVar10 != (SPIRVariable *)0x0) {
    local_138._M_dataplus._M_p._0_4_ = (pSVar10->super_IVariant).self.id;
    sVar16 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars_emulated)._M_h,(key_type *)&local_138);
    if (sVar16 != 0) {
      pBVar17 = ParsedIR::get_decoration_bitset
                          (&(this->super_CompilerGLSL).super_Compiler.ir,
                           (ID)(pSVar10->super_IVariant).self.id);
      local_78[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x2d30fc;
      if ((pBVar17->lower & 0xa00000) == 0) {
        local_78[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x2b1c7b;
      }
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_a0->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_110,this,pSVar18,0);
      join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                (&local_138,(spirv_cross *)0x2d38e3,(char (*) [3])local_78,(char **)"device atomic_"
                 ,(char (*) [15])&local_110,in_R9);
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
      paVar28 = &local_138.field_2;
      psVar29 = psVar30;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar28) {
        operator_delete(local_138._M_dataplus._M_p);
        psVar29 = psVar30;
      }
      paVar2 = &local_110.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,id,true);
      puVar13 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2d6c94);
      puVar24 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_110.field_2._M_allocated_capacity = *puVar24;
        local_110.field_2._8_8_ = puVar13[3];
        local_110._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar24;
        local_110._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_110._M_string_length = puVar13[1];
      *puVar13 = puVar24;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
      psVar22 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_138.field_2._M_allocated_capacity = *psVar22;
        local_138.field_2._8_8_ = puVar13[3];
        local_138._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar22;
        local_138._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_138._M_string_length = puVar13[1];
      *puVar13 = psVar22;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)psVar29,(ulong)local_138._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar28) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return psVar29;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;

	// Physical pointer types are passed by pointer, not reference.
	auto &data_type = get_variable_data_type(var);
	bool passed_by_value = is_physical_pointer(var_type);
	auto &type = passed_by_value ? var_type : data_type;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && !passed_by_value && is_pointer(var_type) && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;
	bool type_is_tlas = type.basetype == SPIRType::AccelerationStructure;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin && !is_mesh_shader())
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if (is_var_runtime_size_array(var))
	{
		const auto *parent_type = &get<SPIRType>(type.parent_type);
		auto type_name = type_to_glsl(*parent_type, arg.id);
		if (type.basetype == SPIRType::AccelerationStructure)
			decl = join("spvDescriptorArray<", type_name, ">");
		else if (type_is_image)
			decl = join("spvDescriptorArray<", cv_qualifier, type_name, ">");
		else
			decl = join("spvDescriptorArray<", address_space, " ", type_name, "*>");
		address_space = "const";
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (is_pointer(data_type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
		{
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
		}
	}

	if (passed_by_value || (!builtin && !is_pointer(var_type) &&
	                        (type_storage == StorageClassFunction || type_storage == StorageClassGeneric)))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type, name_id);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		// spvDescriptorArray absorbs the address space inside the template.
		if (!is_var_runtime_size_array(var))
		{
			const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
			if (argument_buffer_space)
			{
				decl += " ";
				decl += argument_buffer_space;
			}
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else if (is_var_runtime_size_array(var))
		{
			decl += " " + to_expression(name_id);
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type, name_id);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && !type_is_tlas &&
	         (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (is_pointer(data_type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}

		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image || type_is_tlas)
	{
		if (is_var_runtime_size_array(var))
		{
			decl = address_space + " " + decl + " " + to_expression(name_id);
		}
		else if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		auto &flags = ir.get_decoration_bitset(backing_var->self);
		const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
		decl += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(var_type.image.type), 0));
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}